

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TagParser::parse(TagParser *this,string *str)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  string local_50 [32];
  
  for (uVar3 = 0; uVar3 < str->_M_string_length; uVar3 = uVar3 + 1) {
    cVar1 = (str->_M_dataplus)._M_p[uVar3];
    if (cVar1 == '[') {
      uVar2 = std::__cxx11::string::find((char)str,0x5d);
      if (uVar2 == 0xffffffffffffffff) {
        (*this->_vptr_TagParser[3])(this,0x5b);
      }
      else {
        std::__cxx11::string::substr((ulong)local_50,(ulong)str);
        (*this->_vptr_TagParser[2])(this,local_50);
        std::__cxx11::string::~string(local_50);
        uVar3 = uVar2;
      }
    }
    else {
      (*this->_vptr_TagParser[3])(this,(ulong)(uint)(int)cVar1);
    }
  }
  (*this->_vptr_TagParser[4])(this);
  return;
}

Assistant:

void parse( const std::string& str ) {
            std::size_t pos = 0;
            while( pos < str.size() ) {
                char c = str[pos];
                if( c == '[' ) {
                    std::size_t end = str.find_first_of( ']', pos );
                    if( end != std::string::npos ) {
                        acceptTag( str.substr( pos+1, end-pos-1 ) );
                        pos = end+1;
                    }
                    else {
                        acceptChar( c );
                        pos++;
                    }
                }
                else {
                    acceptChar( c );
                    pos++;
                }
            }
            endParse();
        }